

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_tga(char *filename,int x,int y,int comp,void *data)

{
  uint alpha;
  int iVar1;
  uint rgb_dir;
  
  alpha = (uint)((comp - 2U & 0xfffffffd) == 0);
  rgb_dir = (int)(comp - alpha) < 2 | 2;
  iVar1 = outfile(filename,rgb_dir,y,x,y,comp,0,data,alpha,0,"111 221 2222 11",0,0,rgb_dir,0,0,0,0,0
                  ,x,y,comp * 8,alpha << 3);
  return iVar1;
}

Assistant:

int stbi_write_tga(char const *filename, int x, int y, int comp, const void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3
   return outfile(filename, -1,-1, x, y, comp, 0, (void *) data, has_alpha, 0,
                  "111 221 2222 11", 0,0,format, 0,0,0, 0,0,x,y, (colorbytes+has_alpha)*8, has_alpha*8);
}